

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

DdNode * Extra_bddBitsToCube(DdManager *dd,int Code,int CodeWidth,DdNode **pbVars,int fMsbFirst)

{
  byte bVar1;
  DdNode **ppDVar2;
  DdNode *n;
  ulong uVar3;
  int iVar4;
  DdNode *f;
  
  n = dd->one;
  Cudd_Ref(n);
  if (0 < CodeWidth) {
    iVar4 = CodeWidth + -1;
    uVar3 = 0;
    f = n;
    do {
      ppDVar2 = pbVars;
      if (pbVars == (DdNode **)0x0) {
        ppDVar2 = dd->vars;
      }
      bVar1 = (byte)iVar4;
      if (fMsbFirst == 0) {
        bVar1 = (byte)uVar3;
      }
      n = Cudd_bddAnd(dd,f,(DdNode *)
                           ((ulong)((uint)~Code >> (bVar1 & 0x1f) & 1) ^ (ulong)ppDVar2[uVar3]));
      Cudd_Ref(n);
      Cudd_RecursiveDeref(dd,f);
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + -1;
      f = n;
    } while ((uint)CodeWidth != uVar3);
  }
  Cudd_Deref(n);
  return n;
}

Assistant:

DdNode * Extra_bddBitsToCube( DdManager * dd, int Code, int CodeWidth, DdNode ** pbVars, int fMsbFirst )
{
    int z;
    DdNode * bTemp, * bVar, * bVarBdd, * bResult;

    bResult = b1;   Cudd_Ref( bResult );
    for ( z = 0; z < CodeWidth; z++ )
    {
        bVarBdd = (pbVars)? pbVars[z]: dd->vars[z];
        if ( fMsbFirst )
            bVar = Cudd_NotCond( bVarBdd, (Code & (1 << (CodeWidth-1-z)))==0 );
        else
            bVar = Cudd_NotCond( bVarBdd, (Code & (1 << (z)))==0 );
        bResult = Cudd_bddAnd( dd, bTemp = bResult, bVar );     Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bResult );

    return bResult;
}